

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

HighsInt __thiscall presolve::HPresolve::findNonzero(HPresolve *this,HighsInt row,HighsInt col)

{
  pointer piVar1;
  pointer piVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  int *piVar6;
  pointer piVar7;
  int *piVar8;
  pointer piVar9;
  HighsInt y;
  long lVar10;
  long lVar11;
  long lVar12;
  int local_28;
  int local_24;
  HighsInt Nleft;
  
  piVar1 = (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar3 = piVar1[row];
  if (iVar3 == -1) {
    return -1;
  }
  piVar6 = &local_24;
  local_24 = -1;
  piVar8 = &local_28;
  local_28 = -1;
  piVar2 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar9 = (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar7 = (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    lVar12 = (long)iVar3;
    if (col < piVar2[lVar12]) {
      iVar5 = piVar9[lVar12];
      lVar10 = (long)iVar5;
      if (lVar10 == -1) {
        piVar7 = (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar5 = -1;
        goto LAB_003075cb;
      }
      if (col < piVar2[lVar10]) {
        piVar9[lVar12] = piVar7[lVar10];
        piVar7[lVar10] = iVar3;
        lVar12 = lVar10;
        iVar3 = iVar5;
        if (piVar9[lVar10] == -1) goto LAB_003075ad;
      }
      *piVar6 = iVar3;
      piVar4 = piVar9 + lVar12;
      piVar6 = piVar4;
    }
    else {
      lVar10 = lVar12;
      if (col <= piVar2[lVar12]) {
LAB_003075ad:
        piVar9 = (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar5 = piVar9[lVar10];
        lVar12 = lVar10;
LAB_003075cb:
        *piVar8 = iVar5;
        *piVar6 = piVar7[lVar12];
        piVar9[lVar12] = local_28;
        piVar7[lVar12] = local_24;
        piVar1[row] = iVar3;
        if (piVar2[lVar12] != col) {
          return -1;
        }
        return iVar3;
      }
      iVar5 = piVar7[lVar12];
      lVar11 = (long)iVar5;
      if (lVar11 == -1) goto LAB_003075ad;
      if (piVar2[lVar11] < col) {
        piVar7[lVar12] = piVar9[lVar11];
        piVar9[lVar11] = iVar3;
        lVar12 = lVar11;
        lVar10 = lVar11;
        iVar3 = iVar5;
        if (piVar7[lVar11] == -1) goto LAB_003075ad;
      }
      *piVar8 = iVar3;
      piVar4 = piVar7 + lVar12;
      piVar8 = piVar4;
    }
    iVar3 = *piVar4;
  } while( true );
}

Assistant:

HighsInt HPresolve::findNonzero(HighsInt row, HighsInt col) {
  if (rowroot[row] == -1) return -1;

  auto get_row_left = [&](HighsInt pos) -> HighsInt& { return ARleft[pos]; };
  auto get_row_right = [&](HighsInt pos) -> HighsInt& { return ARright[pos]; };
  auto get_row_key = [&](HighsInt pos) { return Acol[pos]; };
  rowroot[row] =
      highs_splay(col, rowroot[row], get_row_left, get_row_right, get_row_key);

  if (Acol[rowroot[row]] == col) return rowroot[row];

  return -1;
}